

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ResultTable.cpp
# Opt level: O1

void __thiscall celero::ResultTable::add(ResultTable *this,shared_ptr<celero::ExperimentResult> *x)

{
  double dVar1;
  _Tuple_impl<0UL,_celero::ResultTable::Impl_*,_std::default_delete<celero::ResultTable::Impl>_>
  _Var2;
  ulong uVar3;
  undefined8 uVar4;
  char cVar5;
  ostream *poVar6;
  Experiment *pEVar7;
  Statistics<long> *pSVar8;
  long lVar9;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>
  *entry;
  pointer ppVar10;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>
  *entry_1;
  double dVar11;
  double dVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  shared_ptr<celero::UserDefinedMeasurementCollector> udmCollector;
  undefined1 local_78 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48;
  _Head_base<0UL,_celero::Experiment::Impl_*,_false> local_38;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_30;
  
  _Var2.super__Head_base<0UL,_celero::ResultTable::Impl_*,_false>._M_head_impl =
       (this->pimpl)._pimpl._M_t.
       super___uniq_ptr_impl<celero::ResultTable::Impl,_std::default_delete<celero::ResultTable::Impl>_>
       ._M_t.
       super__Tuple_impl<0UL,_celero::ResultTable::Impl_*,_std::default_delete<celero::ResultTable::Impl>_>
       .super__Head_base<0UL,_celero::ResultTable::Impl_*,_false>;
  cVar5 = std::__basic_file<char>::is_open();
  if (cVar5 != '\0') {
    if (*(ostream *)
         ((long)_Var2.super__Head_base<0UL,_celero::ResultTable::Impl_*,_false>._M_head_impl + 0x208
         ) == (ostream)0x0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)
                 _Var2.super__Head_base<0UL,_celero::ResultTable::Impl_*,_false>._M_head_impl,
                 "Group,Experiment,Problem Space,Samples,Iterations,Failure,",0x3a);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)
                 (this->pimpl)._pimpl._M_t.
                 super___uniq_ptr_impl<celero::ResultTable::Impl,_std::default_delete<celero::ResultTable::Impl>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_celero::ResultTable::Impl_*,_std::default_delete<celero::ResultTable::Impl>_>
                 .super__Head_base<0UL,_celero::ResultTable::Impl_*,_false>,
                 "Baseline,us/Iteration,Iterations/sec,",0x25);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)
                 (this->pimpl)._pimpl._M_t.
                 super___uniq_ptr_impl<celero::ResultTable::Impl,_std::default_delete<celero::ResultTable::Impl>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_celero::ResultTable::Impl_*,_std::default_delete<celero::ResultTable::Impl>_>
                 .super__Head_base<0UL,_celero::ResultTable::Impl_*,_false>,
                 "T Min (us),T Mean (us),T Max (us),T Variance,T Standard Deviation,T Skewness,T Kurtosis,T Z Score,"
                 ,0x62);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)
                 (this->pimpl)._pimpl._M_t.
                 super___uniq_ptr_impl<celero::ResultTable::Impl,_std::default_delete<celero::ResultTable::Impl>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_celero::ResultTable::Impl_*,_std::default_delete<celero::ResultTable::Impl>_>
                 .super__Head_base<0UL,_celero::ResultTable::Impl_*,_false>,
                 "R Min (us),R Mean (us),R Max (us),R Variance,R Standard Deviation,R Skewness,R Kurtosis,R Z Score,"
                 ,0x62);
      ExperimentResult::getUserDefinedMeasurements
                ((x->super___shared_ptr<celero::ExperimentResult,_(__gnu_cxx::_Lock_policy)2>).
                 _M_ptr);
      UserDefinedMeasurementCollector::getAggregateValues_abi_cxx11_
                ((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
                  *)local_78,(UserDefinedMeasurementCollector *)local_58._M_allocated_capacity);
      uVar4 = local_78._8_8_;
      for (ppVar10 = (pointer)local_78._0_8_; ppVar10 != (pointer)uVar4; ppVar10 = ppVar10 + 1) {
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)
                            (this->pimpl)._pimpl._M_t.
                            super___uniq_ptr_impl<celero::ResultTable::Impl,_std::default_delete<celero::ResultTable::Impl>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_celero::ResultTable::Impl_*,_std::default_delete<celero::ResultTable::Impl>_>
                            .super__Head_base<0UL,_celero::ResultTable::Impl_*,_false>,
                            (ppVar10->first)._M_dataplus._M_p,(ppVar10->first)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,",",1);
      }
      std::
      vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
      ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
                 *)local_78);
      _Var2.super__Head_base<0UL,_celero::ResultTable::Impl_*,_false>._M_head_impl =
           (this->pimpl)._pimpl._M_t.
           super___uniq_ptr_impl<celero::ResultTable::Impl,_std::default_delete<celero::ResultTable::Impl>_>
           ._M_t.
           super__Tuple_impl<0UL,_celero::ResultTable::Impl_*,_std::default_delete<celero::ResultTable::Impl>_>
           .super__Head_base<0UL,_celero::ResultTable::Impl_*,_false>;
      cVar5 = (char)_Var2.super__Head_base<0UL,_celero::ResultTable::Impl_*,_false>._M_head_impl;
      std::ios::widen((char)*(undefined8 *)
                             (*(long *)_Var2.
                                       super__Head_base<0UL,_celero::ResultTable::Impl_*,_false>.
                                       _M_head_impl + -0x18) + cVar5);
      std::ostream::put(cVar5);
      std::ostream::flush();
      *(undefined1 *)
       ((long)(this->pimpl)._pimpl._M_t.
              super___uniq_ptr_impl<celero::ResultTable::Impl,_std::default_delete<celero::ResultTable::Impl>_>
              ._M_t.
              super__Tuple_impl<0UL,_celero::ResultTable::Impl_*,_std::default_delete<celero::ResultTable::Impl>_>
              .super__Head_base<0UL,_celero::ResultTable::Impl_*,_false> + 0x208) = 1;
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._8_8_);
      }
    }
    _Var2.super__Head_base<0UL,_celero::ResultTable::Impl_*,_false>._M_head_impl =
         (this->pimpl)._pimpl._M_t.
         super___uniq_ptr_impl<celero::ResultTable::Impl,_std::default_delete<celero::ResultTable::Impl>_>
         ._M_t.
         super__Tuple_impl<0UL,_celero::ResultTable::Impl_*,_std::default_delete<celero::ResultTable::Impl>_>
         .super__Head_base<0UL,_celero::ResultTable::Impl_*,_false>;
    ExperimentResult::getExperiment
              ((x->super___shared_ptr<celero::ExperimentResult,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
    ;
    Experiment::getBenchmark((Experiment *)&local_38);
    Benchmark::getName_abi_cxx11_((string *)local_78,(Benchmark *)local_38._M_head_impl);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)
                        _Var2.super__Head_base<0UL,_celero::ResultTable::Impl_*,_false>._M_head_impl
                        ,(char *)local_78._0_8_,local_78._8_8_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,",",1);
    pEVar7 = ExperimentResult::getExperiment
                       ((x->super___shared_ptr<celero::ExperimentResult,_(__gnu_cxx::_Lock_policy)2>
                        )._M_ptr);
    Experiment::getName_abi_cxx11_((string *)&local_58,pEVar7);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar6,(char *)local_58._M_allocated_capacity,local_58._8_8_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,",",1);
    ExperimentResult::getProblemSpaceValue
              ((x->super___shared_ptr<celero::ExperimentResult,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
    ;
    poVar6 = std::ostream::_M_insert<long>((long)poVar6);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,",",1);
    pEVar7 = ExperimentResult::getExperiment
                       ((x->super___shared_ptr<celero::ExperimentResult,_(__gnu_cxx::_Lock_policy)2>
                        )._M_ptr);
    Experiment::getSamples(pEVar7);
    poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,",",1);
    ExperimentResult::getProblemSpaceIterations
              ((x->super___shared_ptr<celero::ExperimentResult,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
    ;
    poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,",",1);
    ExperimentResult::getFailure
              ((x->super___shared_ptr<celero::ExperimentResult,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
    ;
    poVar6 = std::ostream::_M_insert<bool>(SUB81(poVar6,0));
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,",",1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_allocated_capacity != &local_48) {
      operator_delete((void *)local_58._M_allocated_capacity,local_48._M_allocated_capacity + 1);
    }
    if ((pointer)local_78._0_8_ != (pointer)(local_78 + 0x10)) {
      operator_delete((void *)local_78._0_8_,(ulong)(local_78._16_8_ + 1));
    }
    if (local_30 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_30);
    }
    dVar11 = ExperimentResult::getBaselineMeasurement
                       ((x->super___shared_ptr<celero::ExperimentResult,_(__gnu_cxx::_Lock_policy)2>
                        )._M_ptr);
    poVar6 = std::ostream::_M_insert<double>(dVar11);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,",",1);
    dVar11 = ExperimentResult::getUsPerCall
                       ((x->super___shared_ptr<celero::ExperimentResult,_(__gnu_cxx::_Lock_policy)2>
                        )._M_ptr);
    poVar6 = std::ostream::_M_insert<double>(dVar11);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,",",1);
    dVar11 = ExperimentResult::getCallsPerSecond
                       ((x->super___shared_ptr<celero::ExperimentResult,_(__gnu_cxx::_Lock_policy)2>
                        )._M_ptr);
    poVar6 = std::ostream::_M_insert<double>(dVar11);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,",",1);
    _Var2.super__Head_base<0UL,_celero::ResultTable::Impl_*,_false>._M_head_impl =
         (this->pimpl)._pimpl._M_t.
         super___uniq_ptr_impl<celero::ResultTable::Impl,_std::default_delete<celero::ResultTable::Impl>_>
         ._M_t.
         super__Tuple_impl<0UL,_celero::ResultTable::Impl_*,_std::default_delete<celero::ResultTable::Impl>_>
         .super__Head_base<0UL,_celero::ResultTable::Impl_*,_false>;
    ExperimentResult::getTimeStatistics
              ((x->super___shared_ptr<celero::ExperimentResult,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
    ;
    poVar6 = std::ostream::_M_insert<long>
                       ((long)_Var2.super__Head_base<0UL,_celero::ResultTable::Impl_*,_false>.
                              _M_head_impl);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,",",1);
    pSVar8 = ExperimentResult::getTimeStatistics
                       ((x->super___shared_ptr<celero::ExperimentResult,_(__gnu_cxx::_Lock_policy)2>
                        )._M_ptr);
    poVar6 = std::ostream::_M_insert<double>(pSVar8->M1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,",",1);
    ExperimentResult::getTimeStatistics
              ((x->super___shared_ptr<celero::ExperimentResult,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
    ;
    poVar6 = std::ostream::_M_insert<long>((long)poVar6);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,",",1);
    pSVar8 = ExperimentResult::getTimeStatistics
                       ((x->super___shared_ptr<celero::ExperimentResult,_(__gnu_cxx::_Lock_policy)2>
                        )._M_ptr);
    if (pSVar8->sampleSize < 2) {
      dVar11 = 0.0;
    }
    else {
      lVar9 = pSVar8->sampleSize - 1;
      auVar13._8_4_ = (int)((ulong)lVar9 >> 0x20);
      auVar13._0_8_ = lVar9;
      auVar13._12_4_ = 0x45300000;
      dVar11 = pSVar8->M2 /
               ((auVar13._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)lVar9) - 4503599627370496.0));
    }
    poVar6 = std::ostream::_M_insert<double>(dVar11);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,",",1);
    pSVar8 = ExperimentResult::getTimeStatistics
                       ((x->super___shared_ptr<celero::ExperimentResult,_(__gnu_cxx::_Lock_policy)2>
                        )._M_ptr);
    if (pSVar8->sampleSize < 2) {
      dVar11 = 0.0;
    }
    else {
      lVar9 = pSVar8->sampleSize - 1;
      auVar14._8_4_ = (int)((ulong)lVar9 >> 0x20);
      auVar14._0_8_ = lVar9;
      auVar14._12_4_ = 0x45300000;
      dVar11 = pSVar8->M2 /
               ((auVar14._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)lVar9) - 4503599627370496.0));
    }
    if (dVar11 < 0.0) {
      dVar11 = sqrt(dVar11);
    }
    else {
      dVar11 = SQRT(dVar11);
    }
    poVar6 = std::ostream::_M_insert<double>(dVar11);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,",",1);
    pSVar8 = ExperimentResult::getTimeStatistics
                       ((x->super___shared_ptr<celero::ExperimentResult,_(__gnu_cxx::_Lock_policy)2>
                        )._M_ptr);
    uVar3 = pSVar8->sampleSize;
    dVar11 = 0.0;
    if (2 < uVar3) {
      auVar15._8_4_ = (int)(uVar3 >> 0x20);
      auVar15._0_8_ = uVar3;
      auVar15._12_4_ = 0x45300000;
      dVar12 = (auVar15._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)uVar3) - 4503599627370496.0);
      if (dVar12 < 0.0) {
        dVar12 = sqrt(dVar12);
      }
      else {
        dVar12 = SQRT(dVar12);
      }
      dVar1 = pSVar8->M3;
      dVar11 = pow(pSVar8->M2,1.5);
      dVar11 = (dVar12 * dVar1) / dVar11;
    }
    poVar6 = std::ostream::_M_insert<double>(dVar11);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,",",1);
    pSVar8 = ExperimentResult::getTimeStatistics
                       ((x->super___shared_ptr<celero::ExperimentResult,_(__gnu_cxx::_Lock_policy)2>
                        )._M_ptr);
    uVar3 = pSVar8->sampleSize;
    dVar11 = 0.0;
    if (3 < uVar3) {
      dVar12 = pSVar8->M2;
      if ((dVar12 != 0.0) || (NAN(dVar12))) {
        auVar16._8_4_ = (int)(uVar3 >> 0x20);
        auVar16._0_8_ = uVar3;
        auVar16._12_4_ = 0x45300000;
        dVar11 = (((auVar16._8_8_ - 1.9342813113834067e+25) +
                  ((double)CONCAT44(0x43300000,(int)uVar3) - 4503599627370496.0)) * pSVar8->M4) /
                 (dVar12 * dVar12) + -3.0;
      }
    }
    poVar6 = std::ostream::_M_insert<double>(dVar11);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,",",1);
    pSVar8 = ExperimentResult::getTimeStatistics
                       ((x->super___shared_ptr<celero::ExperimentResult,_(__gnu_cxx::_Lock_policy)2>
                        )._M_ptr);
    if (pSVar8->sampleSize < 2) {
      dVar11 = 0.0;
    }
    else {
      lVar9 = pSVar8->sampleSize - 1;
      auVar21._8_4_ = (int)((ulong)lVar9 >> 0x20);
      auVar21._0_8_ = lVar9;
      auVar21._12_4_ = 0x45300000;
      dVar11 = pSVar8->M2 /
               ((auVar21._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)lVar9) - 4503599627370496.0));
    }
    if (dVar11 < 0.0) {
      dVar11 = sqrt(dVar11);
    }
    else {
      dVar11 = SQRT(dVar11);
    }
    dVar12 = 0.0;
    if ((dVar11 != 0.0) || (NAN(dVar11))) {
      dVar12 = (pSVar8->M1 - (double)pSVar8->min) / dVar11;
    }
    poVar6 = std::ostream::_M_insert<double>(dVar12);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,",",1);
    _Var2.super__Head_base<0UL,_celero::ResultTable::Impl_*,_false>._M_head_impl =
         (this->pimpl)._pimpl._M_t.
         super___uniq_ptr_impl<celero::ResultTable::Impl,_std::default_delete<celero::ResultTable::Impl>_>
         ._M_t.
         super__Tuple_impl<0UL,_celero::ResultTable::Impl_*,_std::default_delete<celero::ResultTable::Impl>_>
         .super__Head_base<0UL,_celero::ResultTable::Impl_*,_false>;
    ExperimentResult::getRAMStatistics
              ((x->super___shared_ptr<celero::ExperimentResult,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
    ;
    poVar6 = std::ostream::_M_insert<long>
                       ((long)_Var2.super__Head_base<0UL,_celero::ResultTable::Impl_*,_false>.
                              _M_head_impl);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,",",1);
    pSVar8 = ExperimentResult::getRAMStatistics
                       ((x->super___shared_ptr<celero::ExperimentResult,_(__gnu_cxx::_Lock_policy)2>
                        )._M_ptr);
    poVar6 = std::ostream::_M_insert<double>(pSVar8->M1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,",",1);
    ExperimentResult::getRAMStatistics
              ((x->super___shared_ptr<celero::ExperimentResult,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
    ;
    poVar6 = std::ostream::_M_insert<long>((long)poVar6);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,",",1);
    pSVar8 = ExperimentResult::getRAMStatistics
                       ((x->super___shared_ptr<celero::ExperimentResult,_(__gnu_cxx::_Lock_policy)2>
                        )._M_ptr);
    if (pSVar8->sampleSize < 2) {
      dVar11 = 0.0;
    }
    else {
      lVar9 = pSVar8->sampleSize - 1;
      auVar17._8_4_ = (int)((ulong)lVar9 >> 0x20);
      auVar17._0_8_ = lVar9;
      auVar17._12_4_ = 0x45300000;
      dVar11 = pSVar8->M2 /
               ((auVar17._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)lVar9) - 4503599627370496.0));
    }
    poVar6 = std::ostream::_M_insert<double>(dVar11);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,",",1);
    pSVar8 = ExperimentResult::getRAMStatistics
                       ((x->super___shared_ptr<celero::ExperimentResult,_(__gnu_cxx::_Lock_policy)2>
                        )._M_ptr);
    if (pSVar8->sampleSize < 2) {
      dVar11 = 0.0;
    }
    else {
      lVar9 = pSVar8->sampleSize - 1;
      auVar18._8_4_ = (int)((ulong)lVar9 >> 0x20);
      auVar18._0_8_ = lVar9;
      auVar18._12_4_ = 0x45300000;
      dVar11 = pSVar8->M2 /
               ((auVar18._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)lVar9) - 4503599627370496.0));
    }
    if (dVar11 < 0.0) {
      dVar11 = sqrt(dVar11);
    }
    else {
      dVar11 = SQRT(dVar11);
    }
    poVar6 = std::ostream::_M_insert<double>(dVar11);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,",",1);
    pSVar8 = ExperimentResult::getRAMStatistics
                       ((x->super___shared_ptr<celero::ExperimentResult,_(__gnu_cxx::_Lock_policy)2>
                        )._M_ptr);
    uVar3 = pSVar8->sampleSize;
    dVar11 = 0.0;
    if (2 < uVar3) {
      auVar19._8_4_ = (int)(uVar3 >> 0x20);
      auVar19._0_8_ = uVar3;
      auVar19._12_4_ = 0x45300000;
      dVar12 = (auVar19._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)uVar3) - 4503599627370496.0);
      if (dVar12 < 0.0) {
        dVar12 = sqrt(dVar12);
      }
      else {
        dVar12 = SQRT(dVar12);
      }
      dVar1 = pSVar8->M3;
      dVar11 = pow(pSVar8->M2,1.5);
      dVar11 = (dVar12 * dVar1) / dVar11;
    }
    poVar6 = std::ostream::_M_insert<double>(dVar11);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,",",1);
    pSVar8 = ExperimentResult::getRAMStatistics
                       ((x->super___shared_ptr<celero::ExperimentResult,_(__gnu_cxx::_Lock_policy)2>
                        )._M_ptr);
    uVar3 = pSVar8->sampleSize;
    dVar11 = 0.0;
    if (3 < uVar3) {
      dVar12 = pSVar8->M2;
      if ((dVar12 != 0.0) || (NAN(dVar12))) {
        auVar20._8_4_ = (int)(uVar3 >> 0x20);
        auVar20._0_8_ = uVar3;
        auVar20._12_4_ = 0x45300000;
        dVar11 = (((auVar20._8_8_ - 1.9342813113834067e+25) +
                  ((double)CONCAT44(0x43300000,(int)uVar3) - 4503599627370496.0)) * pSVar8->M4) /
                 (dVar12 * dVar12) + -3.0;
      }
    }
    poVar6 = std::ostream::_M_insert<double>(dVar11);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,",",1);
    pSVar8 = ExperimentResult::getRAMStatistics
                       ((x->super___shared_ptr<celero::ExperimentResult,_(__gnu_cxx::_Lock_policy)2>
                        )._M_ptr);
    if (pSVar8->sampleSize < 2) {
      dVar11 = 0.0;
    }
    else {
      lVar9 = pSVar8->sampleSize - 1;
      auVar22._8_4_ = (int)((ulong)lVar9 >> 0x20);
      auVar22._0_8_ = lVar9;
      auVar22._12_4_ = 0x45300000;
      dVar11 = pSVar8->M2 /
               ((auVar22._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)lVar9) - 4503599627370496.0));
    }
    if (dVar11 < 0.0) {
      dVar11 = sqrt(dVar11);
    }
    else {
      dVar11 = SQRT(dVar11);
    }
    dVar12 = 0.0;
    if ((dVar11 != 0.0) || (NAN(dVar11))) {
      dVar12 = (pSVar8->M1 - (double)pSVar8->min) / dVar11;
    }
    poVar6 = std::ostream::_M_insert<double>(dVar12);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,",",1);
    ExperimentResult::getUserDefinedMeasurements
              ((x->super___shared_ptr<celero::ExperimentResult,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
    ;
    UserDefinedMeasurementCollector::getAggregateValues_abi_cxx11_
              ((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
                *)local_78,(UserDefinedMeasurementCollector *)local_58._M_allocated_capacity);
    for (; local_78._0_8_ != local_78._8_8_; local_78._0_8_ = local_78._0_8_ + 0x28) {
      poVar6 = std::ostream::_M_insert<double>(((pointer)local_78._0_8_)->second);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,",",1);
    }
    std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
    ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
               *)local_78);
    _Var2.super__Head_base<0UL,_celero::ResultTable::Impl_*,_false>._M_head_impl =
         (this->pimpl)._pimpl._M_t.
         super___uniq_ptr_impl<celero::ResultTable::Impl,_std::default_delete<celero::ResultTable::Impl>_>
         ._M_t.
         super__Tuple_impl<0UL,_celero::ResultTable::Impl_*,_std::default_delete<celero::ResultTable::Impl>_>
         .super__Head_base<0UL,_celero::ResultTable::Impl_*,_false>;
    cVar5 = (char)_Var2.super__Head_base<0UL,_celero::ResultTable::Impl_*,_false>._M_head_impl;
    std::ios::widen((char)*(undefined8 *)
                           (*(long *)_Var2.super__Head_base<0UL,_celero::ResultTable::Impl_*,_false>
                                     ._M_head_impl + -0x18) + cVar5);
    std::ostream::put(cVar5);
    std::ostream::flush();
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._8_8_);
    }
  }
  return;
}

Assistant:

void ResultTable::add(std::shared_ptr<celero::ExperimentResult> x)
{
	if(this->pimpl->ofs.is_open() == true)
	{
		if(this->pimpl->hasWrittenHeader == false)
		{
			// Print the header for the table.
			this->pimpl->ofs << "Group,Experiment,Problem Space,Samples,Iterations,Failure,";

			this->pimpl->ofs << "Baseline,us/Iteration,Iterations/sec,";

			this->pimpl->ofs << "T Min (us),T Mean (us),T Max (us),T Variance,T Standard Deviation,T Skewness,T Kurtosis,T Z Score,";
			this->pimpl->ofs << "R Min (us),R Mean (us),R Max (us),R Variance,R Standard Deviation,R Skewness,R Kurtosis,R Z Score,";

			// User Defined Metrics
			const auto udmCollector = x->getUserDefinedMeasurements();
			for(const auto& entry : udmCollector->getAggregateValues())
			{
				this->pimpl->ofs << entry.first << ",";
			}

			// Purposefully flushing the buffer here.
			this->pimpl->ofs << std::endl;

			this->pimpl->hasWrittenHeader = true;
		}

		// Description
		this->pimpl->ofs << x->getExperiment()->getBenchmark()->getName() << "," << x->getExperiment()->getName() << "," << x->getProblemSpaceValue()
						 << "," << x->getExperiment()->getSamples() << "," << x->getProblemSpaceIterations() << "," << x->getFailure() << ",";

		// Measurements
		this->pimpl->ofs << x->getBaselineMeasurement() << "," << x->getUsPerCall() << "," << x->getCallsPerSecond() << ",";

		// Statistics
		this->pimpl->ofs << x->getTimeStatistics().getMin() << "," << x->getTimeStatistics().getMean() << "," << x->getTimeStatistics().getMax()
						 << "," << x->getTimeStatistics().getVariance() << "," << x->getTimeStatistics().getStandardDeviation() << ","
						 << x->getTimeStatistics().getSkewness() << "," << x->getTimeStatistics().getKurtosis() << ","
						 << x->getTimeStatistics().getZScore() << ",";

		// Statistics
		this->pimpl->ofs << x->getRAMStatistics().getMin() << "," << x->getRAMStatistics().getMean() << "," << x->getRAMStatistics().getMax() << ","
						 << x->getRAMStatistics().getVariance() << "," << x->getRAMStatistics().getStandardDeviation() << ","
						 << x->getRAMStatistics().getSkewness() << "," << x->getRAMStatistics().getKurtosis() << ","
						 << x->getRAMStatistics().getZScore() << ",";

		// User Defined Metrics
		const auto udmCollector = x->getUserDefinedMeasurements();
		for(const auto& entry : udmCollector->getAggregateValues())
		{
			this->pimpl->ofs << entry.second << ",";
		}

		// Purposefully flushing the buffer here.
		this->pimpl->ofs << std::endl;
	}
}